

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_set_layer_id(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  AV1_COMP *pAVar5;
  undefined8 *puVar6;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar6 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar6 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar6 + 1;
  }
  piVar4 = (int *)*puVar6;
  iVar2 = *piVar4;
  pAVar5 = ctx->ppi->cpi;
  (pAVar5->common).spatial_layer_id = iVar2;
  iVar3 = piVar4[1];
  (pAVar5->common).temporal_layer_id = iVar3;
  (pAVar5->svc).spatial_layer_id = iVar2;
  (pAVar5->svc).temporal_layer_id = iVar3;
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_set_layer_id(aom_codec_alg_priv_t *ctx,
                                         va_list args) {
  aom_svc_layer_id_t *const data = va_arg(args, aom_svc_layer_id_t *);
  ctx->ppi->cpi->common.spatial_layer_id = data->spatial_layer_id;
  ctx->ppi->cpi->common.temporal_layer_id = data->temporal_layer_id;
  ctx->ppi->cpi->svc.spatial_layer_id = data->spatial_layer_id;
  ctx->ppi->cpi->svc.temporal_layer_id = data->temporal_layer_id;
  return AOM_CODEC_OK;
}